

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O3

void __thiscall ncnn::DeformableConv2D_x86_avx::create_pipeline(DeformableConv2D_x86_avx *this)

{
  Option *in_RSI;
  
  create_pipeline((DeformableConv2D_x86_avx *)
                  ((long)&this->_vptr_DeformableConv2D_x86_avx +
                  (long)this->_vptr_DeformableConv2D_x86_avx[-6]),in_RSI);
  return;
}

Assistant:

int DeformableConv2D_x86_avx::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}